

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O3

void __thiscall
IRBuilderAsmJs::BuildAsmSimdTypedArr
          (IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset,uint32 slotIndex,RegSlot value,
          ViewType viewType,uint8 dataWidth,uint32 simdOffset)

{
  undefined1 *puVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  OpCode opcode;
  RegSlot srcRegSlot;
  RegSlot srcRegSlot_00;
  undefined4 *puVar6;
  RegOpnd *src2Opnd;
  RegOpnd *indexOpnd;
  RegOpnd *baseOpnd;
  IndirOpnd *this_00;
  IndirOpnd *this_01;
  Instr *instr;
  undefined6 in_register_00000032;
  ObjectType objectType;
  Func *func;
  IRType type;
  int iVar7;
  IndirOpnd *pIVar8;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32 [4];
  ValueType arrayType;
  
  srcRegSlot = GetRegSlotFromTypedReg(this,value,SIMD);
  iVar7 = (int)CONCAT62(in_register_00000032,newOpcode);
  opcode = GetSimdOpcode(this,newOpcode);
  ValueType::ValueType((ValueType *)&local_32[0].field_0);
  bVar4 = true;
  if (0x1fd < iVar7) {
    switch(iVar7) {
    case 0x1fe:
      type = TySimd128U4;
      break;
    case 0x1ff:
      type = TySimd128U4;
      goto switchD_0050927f_caseD_1a2;
    case 0x200:
      type = TySimd128U4;
      goto switchD_0050927f_caseD_1a5;
    case 0x201:
      type = TySimd128U4;
      goto switchD_0050927f_caseD_1a6;
    default:
      switch(iVar7) {
      case 0x221:
        type = TySimd128U8;
        break;
      case 0x222:
        type = TySimd128U8;
        goto switchD_0050927f_caseD_1a2;
      case 0x223:
        type = TySimd128U8;
        goto switchD_0050927f_caseD_1a5;
      case 0x224:
        type = TySimd128U8;
        goto switchD_0050927f_caseD_1a6;
      default:
        switch(iVar7) {
        case 0x244:
          type = TySimd128U16;
          break;
        case 0x245:
          type = TySimd128U16;
          goto switchD_0050927f_caseD_1a2;
        case 0x246:
          type = TySimd128U16;
          goto switchD_0050927f_caseD_1a5;
        case 0x247:
          type = TySimd128U16;
          goto switchD_0050927f_caseD_1a6;
        default:
          goto switchD_00509226_default;
        }
      }
    }
    goto switchD_0050927f_caseD_1a1;
  }
  type = TySimd128I4;
  switch(iVar7) {
  case 0x1a1:
    break;
  case 0x1a2:
    goto switchD_0050927f_caseD_1a2;
  case 0x1a3:
    type = TySimd128F4;
    break;
  case 0x1a4:
    type = TySimd128F4;
    goto switchD_0050927f_caseD_1a2;
  case 0x1a5:
    goto switchD_0050927f_caseD_1a5;
  case 0x1a6:
    goto switchD_0050927f_caseD_1a6;
  case 0x1a7:
switchD_0050927f_caseD_1a7:
    type = TySimd128F4;
    goto switchD_0050927f_caseD_1a5;
  case 0x1a8:
    type = TySimd128F4;
    goto switchD_0050927f_caseD_1a6;
  default:
    switch(iVar7) {
    case 0x180:
      type = TySimd128I16;
      break;
    case 0x181:
      type = TySimd128I16;
      goto switchD_0050927f_caseD_1a2;
    case 0x182:
      type = TySimd128I16;
      goto switchD_0050927f_caseD_1a5;
    case 0x183:
      type = TySimd128I16;
      goto switchD_0050927f_caseD_1a6;
    default:
      switch(iVar7) {
      case 0x1d4:
        type = TySimd128I8;
        break;
      case 0x1d5:
        type = TySimd128I8;
        goto switchD_0050927f_caseD_1a2;
      case 0x1d6:
        type = TySimd128I8;
        goto switchD_0050927f_caseD_1a5;
      case 0x1d7:
        type = TySimd128I8;
        goto switchD_0050927f_caseD_1a6;
      default:
switchD_00509226_default:
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                           ,0x1b12,"((0))","UNREACHED");
        if (!bVar4) goto LAB_00509701;
        *puVar6 = 0;
        goto switchD_0050927f_caseD_1a7;
      }
    }
  }
switchD_0050927f_caseD_1a1:
  bVar3 = false;
LAB_005093b1:
  switch(viewType) {
  case TYPE_INT8:
  case TYPE_INT8_TO_INT64:
    objectType = Int8Array;
    break;
  case TYPE_UINT8:
  case TYPE_UINT8_TO_INT64:
    objectType = Uint8Array;
    break;
  case TYPE_INT16:
  case TYPE_INT16_TO_INT64:
    objectType = Int16Array;
    break;
  case TYPE_UINT16:
  case TYPE_UINT16_TO_INT64:
    objectType = Uint16Array;
    break;
  case TYPE_INT32:
  case TYPE_INT32_TO_INT64:
    objectType = Int32Array;
    break;
  case TYPE_UINT32:
  case TYPE_UINT32_TO_INT64:
    objectType = Uint32Array;
    break;
  case TYPE_FLOAT32:
    objectType = Float32Array;
    break;
  case TYPE_FLOAT64:
    objectType = Float64Array;
    break;
  case TYPE_INT64:
    objectType = Int64Array;
    break;
  default:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0x1b1d,"((0))","UNREACHED");
    if (!bVar5) goto LAB_00509701;
    *puVar6 = 0;
    goto LAB_0050946b;
  }
  local_32[0].field_0 =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       ValueType::GetObject(objectType);
LAB_0050946b:
  src2Opnd = BuildSrcOpnd(this,5,TyUint32);
  if (bVar3) {
    indexOpnd = (RegOpnd *)0x0;
  }
  else {
    srcRegSlot_00 = GetRegSlotFromTypedReg(this,slotIndex,INT32);
    indexOpnd = BuildSrcOpnd(this,srcRegSlot_00,TyInt32);
  }
  baseOpnd = BuildSrcOpnd(this,4,TyVar);
  IR::Opnd::SetValueType(&baseOpnd->super_Opnd,(ValueType)local_32[0].field_0);
  puVar1 = &(baseOpnd->super_Opnd).field_0xb;
  *puVar1 = *puVar1 | 1;
  if (bVar4) {
    this_00 = (IndirOpnd *)BuildDstOpnd(this,srcRegSlot,type);
    IR::Opnd::SetValueType((Opnd *)this_00,(ValueType)0x4000);
    if (bVar3) {
      this_01 = IR::IndirOpnd::New(baseOpnd,slotIndex,type,this->m_func,false);
    }
    else {
      if (indexOpnd == (RegOpnd *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                           ,0x1b35,"(addrOpnd)","addrOpnd");
        if (!bVar4) goto LAB_00509701;
        *puVar6 = 0;
      }
      this_01 = IR::IndirOpnd::New(baseOpnd,indexOpnd,type,this->m_func);
    }
    func = this->m_func;
    pIVar8 = this_01;
  }
  else {
    this_01 = (IndirOpnd *)BuildSrcOpnd(this,srcRegSlot,type);
    IR::Opnd::SetValueType((Opnd *)this_01,(ValueType)0x4000);
    if (bVar3) {
      this_00 = IR::IndirOpnd::New(baseOpnd,slotIndex,type,this->m_func,false);
    }
    else {
      if (indexOpnd == (RegOpnd *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                           ,0x1b4a,"(addrOpnd)","addrOpnd");
        if (!bVar4) goto LAB_00509701;
        *puVar6 = 0;
      }
      this_00 = IR::IndirOpnd::New(baseOpnd,indexOpnd,type,this->m_func);
    }
    func = this->m_func;
    pIVar8 = this_00;
  }
  instr = IR::Instr::New(opcode,&this_00->super_Opnd,&this_01->super_Opnd,&src2Opnd->super_Opnd,func
                        );
  if (0xc < (byte)(dataWidth - 4)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0x1b5a,"(dataWidth >= 4 && dataWidth <= 16)",
                       "dataWidth >= 4 && dataWidth <= 16");
    if (!bVar4) {
LAB_00509701:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  instr->dataWidth = dataWidth;
  pIVar8->m_offset = simdOffset;
  (pIVar8->super_Opnd).field_0xe = 0;
  AddInstr(this,instr,offset);
  return;
switchD_0050927f_caseD_1a6:
  bVar3 = true;
  goto LAB_005093a1;
switchD_0050927f_caseD_1a5:
  bVar3 = false;
LAB_005093a1:
  bVar4 = false;
  goto LAB_005093b1;
switchD_0050927f_caseD_1a2:
  bVar3 = true;
  bVar4 = true;
  goto LAB_005093b1;
}

Assistant:

void
IRBuilderAsmJs::BuildAsmSimdTypedArr(Js::OpCodeAsmJs newOpcode, uint32 offset, uint32 slotIndex, Js::RegSlot value, Js::ArrayBufferView::ViewType viewType, uint8 dataWidth, uint32 simdOffset)
{
    IRType type = TySimd128F4;
    Js::RegSlot valueRegSlot = GetRegSlotFromSimd128Reg(value);

    IR::RegOpnd * addrOpnd = nullptr;

    Js::OpCode op = GetSimdOpcode(newOpcode);
    ValueType arrayType;
    bool isLd = false, isConst = false;

    switch (newOpcode)
    {
    case Js::OpCodeAsmJs::Simd128_LdArr_I4:
        isLd = true;
        isConst = false;
        type = TySimd128I4;
        break;
    case Js::OpCodeAsmJs::Simd128_LdArr_I8:
        isLd = true;
        isConst = false;
        type = TySimd128I8;
        break;
    case Js::OpCodeAsmJs::Simd128_LdArr_I16:
        isLd = true;
        isConst = false;
        type = TySimd128I16;
        break;
    case Js::OpCodeAsmJs::Simd128_LdArr_U4:
        isLd = true;
        isConst = false;
        type = TySimd128U4;
        break;
    case Js::OpCodeAsmJs::Simd128_LdArr_U8:
        isLd = true;
        isConst = false;
        type = TySimd128U8;
        break;
    case Js::OpCodeAsmJs::Simd128_LdArr_U16:
        isLd = true;
        isConst = false;
        type = TySimd128U16;
        break;
    case Js::OpCodeAsmJs::Simd128_LdArr_F4:
        isLd = true;
        isConst = false;
        type = TySimd128F4;
        break;
#if 0
    case Js::OpCodeAsmJs::Simd128_LdArr_D2:
        isLd = true;
        isConst = false;
        type = TySimd128D2;
        break;
#endif // 0

    case Js::OpCodeAsmJs::Simd128_StArr_I4:
        isLd = false;
        isConst = false;
        type = TySimd128I4;
        break;
    case Js::OpCodeAsmJs::Simd128_StArr_I8:
        isLd = false;
        isConst = false;
        type = TySimd128I8;
        break;
    case Js::OpCodeAsmJs::Simd128_StArr_I16:
        isLd = false;
        isConst = false;
        type = TySimd128I16;
        break;
    case Js::OpCodeAsmJs::Simd128_StArr_U4:
        isLd = false;
        isConst = false;
        type = TySimd128U4;
        break;
    case Js::OpCodeAsmJs::Simd128_StArr_U8:
        isLd = false;
        isConst = false;
        type = TySimd128U8;
        break;
    case Js::OpCodeAsmJs::Simd128_StArr_U16:
        isLd = false;
        isConst = false;
        type = TySimd128U16;
        break;
    case Js::OpCodeAsmJs::Simd128_StArr_F4:
        isLd = false;
        isConst = false;
        type = TySimd128F4;
        break;
#if 0
    case Js::OpCodeAsmJs::Simd128_StArr_D2:
        isLd = false;
        isConst = false;
        type = TySimd128D2;
        break;
#endif // 0

    case Js::OpCodeAsmJs::Simd128_LdArrConst_I4:
        isLd = true;
        isConst = true;
        type = TySimd128I4;
        break;
    case Js::OpCodeAsmJs::Simd128_LdArrConst_I8:
        isLd = true;
        isConst = true;
        type = TySimd128I8;
        break;
    case Js::OpCodeAsmJs::Simd128_LdArrConst_I16:
        isLd = true;
        isConst = true;
        type = TySimd128I16;
        break;
    case Js::OpCodeAsmJs::Simd128_LdArrConst_U4:
        isLd = true;
        isConst = true;
        type = TySimd128U4;
        break;
    case Js::OpCodeAsmJs::Simd128_LdArrConst_U8:
        isLd = true;
        isConst = true;
        type = TySimd128U8;
        break;
    case Js::OpCodeAsmJs::Simd128_LdArrConst_U16:
        isLd = true;
        isConst = true;
        type = TySimd128U16;
        break;
    case Js::OpCodeAsmJs::Simd128_LdArrConst_F4:
        isLd = true;
        isConst = true;
        type = TySimd128F4;
        break;
#if 0
    case Js::OpCodeAsmJs::Simd128_LdArrConst_D2:
        isLd = true;
        isConst = true;
        type = TySimd128D2;
        break;
#endif
    case Js::OpCodeAsmJs::Simd128_StArrConst_I4:
        isLd = false;
        type = TySimd128I4;
        isConst = true;
        break;
    case Js::OpCodeAsmJs::Simd128_StArrConst_I8:
        isLd = false;
        isConst = true;
        type = TySimd128I8;
        break;
    case Js::OpCodeAsmJs::Simd128_StArrConst_I16:
        isLd = false;
        isConst = true;
        type = TySimd128I16;
        break;
    case Js::OpCodeAsmJs::Simd128_StArrConst_U4:
        isLd = false;
        isConst = true;
        type = TySimd128U4;
        break;
    case Js::OpCodeAsmJs::Simd128_StArrConst_U8:
        isLd = false;
        isConst = true;
        type = TySimd128U8;
        break;
    case Js::OpCodeAsmJs::Simd128_StArrConst_U16:
        isLd = false;
        isConst = true;
        type = TySimd128U16;
        break;
    case Js::OpCodeAsmJs::Simd128_StArrConst_F4:
        isLd = false;
        isConst = true;
        type = TySimd128F4;
        break;
#if 0
    case Js::OpCodeAsmJs::Simd128_StArrConst_D2:
        isLd = false;
        isConst = true;
        type = TySimd128D2;
        break;
#endif
    default:
        Assert(UNREACHED);
    }

    switch (viewType)
    {
#define ARRAYBUFFER_VIEW(name, align, RegType, MemType, irSuffix) \
    case Js::ArrayBufferView::TYPE_##name: \
        arrayType = ValueType::GetObject(ObjectType::##irSuffix##Array); \
        break;
#include "Language/AsmJsArrayBufferViews.h"
    default:
        Assert(UNREACHED);
    }

    IR::Opnd * sizeOpnd = BuildSrcOpnd(AsmJsRegSlots::LengthReg, TyUint32);
    if (!isConst)
    {

        Js::RegSlot indexRegSlot = GetRegSlotFromIntReg(slotIndex);
        addrOpnd = BuildSrcOpnd(indexRegSlot, TyInt32);
    }

    IR::Instr * instr = nullptr;
    IR::RegOpnd * regOpnd = nullptr;
    IR::IndirOpnd * indirOpnd = nullptr;
    IR::RegOpnd * baseOpnd = BuildSrcOpnd(AsmJsRegSlots::BufferReg, TyVar);
    baseOpnd->SetValueType(arrayType);
    baseOpnd->SetValueTypeFixed();

    if (isLd)
    {
        regOpnd = BuildDstOpnd(valueRegSlot, type);
        regOpnd->SetValueType(ValueType::Simd);
        if (!isConst)
        {
            Assert(addrOpnd);
            // Js::OpCodeAsmJs::Simd128_LdArr_I4:
            // Js::OpCodeAsmJs::Simd128_LdArr_F4:
            // Js::OpCodeAsmJs::Simd128_LdArr_D2:
            indirOpnd = IR::IndirOpnd::New(baseOpnd, addrOpnd, type, m_func);
        }
        else
        {
            // Js::OpCodeAsmJs::Simd128_LdArrConst_I4:
            // Js::OpCodeAsmJs::Simd128_LdArrConst_F4:
            // Js::OpCodeAsmJs::Simd128_LdArrConst_D2:
            indirOpnd = IR::IndirOpnd::New(baseOpnd, slotIndex, type, m_func);
        }
        instr = IR::Instr::New(op, regOpnd, indirOpnd, sizeOpnd, m_func);
    }
    else
    {
        regOpnd = BuildSrcOpnd(valueRegSlot, type);
        regOpnd->SetValueType(ValueType::Simd);
        if (!isConst)
        {
            Assert(addrOpnd);
            // Js::OpCodeAsmJs::Simd128_StArr_I4:
            // Js::OpCodeAsmJs::Simd128_StArr_F4:
            // Js::OpCodeAsmJs::Simd128_StArr_D2:
            indirOpnd = IR::IndirOpnd::New(baseOpnd, addrOpnd, type, m_func);
        }
        else
        {
            // Js::OpCodeAsmJs::Simd128_StArrConst_I4:
            // Js::OpCodeAsmJs::Simd128_StArrConst_F4:
            // Js::OpCodeAsmJs::Simd128_StArrConst_D2:
            indirOpnd = IR::IndirOpnd::New(baseOpnd, slotIndex, type, m_func);
        }
        instr = IR::Instr::New(op, indirOpnd, regOpnd, sizeOpnd, m_func);
    }
    // REVIEW: Store dataWidth in the instruction itself instead of an argument to avoid using ExtendedArgs or excessive opcodes.
    Assert(dataWidth >= 4 && dataWidth <= 16);
    instr->dataWidth = dataWidth;
    indirOpnd->SetOffset(simdOffset);
    AddInstr(instr, offset);

}